

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
SteamIRCCommand::trigger
          (SteamIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  long *plVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  size_t sVar10;
  uint uVar11;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  string msg;
  string playerName;
  
  pcVar7 = channel._M_str;
  sVar10 = channel._M_len;
  pcVar8 = pcVar7;
  lVar2 = Jupiter::IRC::Client::getChannel(source,sVar10,pcVar7);
  if (lVar2 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    if (parameters._M_len == 0) {
      uVar11 = 0;
      while( true ) {
        RenX::getCore();
        uVar3 = RenX::Core::getServerCount();
        if (uVar3 == uVar11) break;
        uVar3 = RenX::getCore();
        lVar2 = RenX::Core::getServer(uVar3);
        cVar1 = RenX::Server::isLogChanType((int)lVar2);
        if (cVar1 != '\0') {
          uVar6 = 0;
          uVar9 = 0;
          plVar5 = (long *)(lVar2 + 0x10);
          while( true ) {
            plVar5 = (long *)*plVar5;
            if (plVar5 == (long *)(lVar2 + 0x10)) break;
            if (*(char *)(plVar5 + 0x22) == '\0') {
              uVar6 = uVar6 + 1;
              uVar9 = (uVar9 + 1) - (uint)(plVar5[0x1f] == 0);
            }
          }
          if (uVar6 == 0) {
            Jupiter::IRC::Client::sendMessage(source,sVar10,pcVar7,0x17,"No players are in-game.");
          }
          else {
            string_printf_abi_cxx11_
                      (&msg,"%.2f%% (%u/%u) of players are using Steam.",
                       ((double)uVar9 * 100.0) / (double)uVar6);
            Jupiter::IRC::Client::sendMessage
                      (source,sVar10,pcVar7,msg._M_string_length,msg._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&msg);
          }
        }
        uVar11 = uVar11 + 1;
      }
    }
    else {
      msg._M_dataplus._M_p = (pointer)&msg.field_2;
      msg._M_string_length = 0;
      msg.field_2._M_local_buf[0] = '\0';
      uVar11 = 0;
      while( true ) {
        RenX::getCore();
        uVar3 = RenX::Core::getServerCount();
        if (uVar3 == uVar11) break;
        uVar3 = RenX::getCore();
        lVar2 = RenX::Core::getServer(uVar3);
        cVar1 = RenX::Server::isLogChanType((int)lVar2);
        if (cVar1 != '\0') {
          plVar5 = (long *)(lVar2 + 0x10);
          while (plVar5 = (long *)*plVar5, plVar5 != (long *)(lVar2 + 0x10)) {
            rhs._M_str = pcVar8;
            rhs._M_len = (size_t)parameters._M_str;
            sVar4 = jessilib::findi<char,char>
                              ((jessilib *)(plVar5 + 3),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               parameters._M_len,rhs);
            if (sVar4 != 0xffffffffffffffff) {
              RenX::getFormattedPlayerName_abi_cxx11_((PlayerInfo *)&playerName);
              string_printf_abi_cxx11_
                        ((string *)&stack0xffffffffffffffb0,"\x0303[Steam] \x03%.*s (ID: %d) ",
                         playerName._M_string_length,playerName._M_dataplus._M_p,
                         (ulong)*(uint *)((long)plVar5 + 0x10c));
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xffffffffffffffb0);
              std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
              if (plVar5[0x1f] == 0) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&msg,"is not using steam.");
              }
              else {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&msg,"is using steam ID \x02");
                RenX::Server::formatSteamID_abi_cxx11_((PlayerInfo *)&stack0xffffffffffffffb0);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &stack0xffffffffffffffb0);
                std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
                string_printf_abi_cxx11_
                          ((string *)&stack0xffffffffffffffb0,
                           "\x02; Steam Profile: \x02https://steamcommunity.com/profiles/%llu\x02",
                           plVar5[0x1f]);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &stack0xffffffffffffffb0);
                std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
              }
              pcVar8 = (char *)msg._M_string_length;
              Jupiter::IRC::Client::sendMessage
                        (source,sVar10,pcVar7,msg._M_string_length,msg._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&playerName);
            }
          }
        }
        uVar11 = uVar11 + 1;
      }
      if (msg._M_string_length == 0) {
        Jupiter::IRC::Client::sendNotice
                  (source,nick._M_len,nick._M_str,0x18,"Error: Player not found.");
      }
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return;
}

Assistant:

void SteamIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr) {
		int type = chan->getType();
		if (!parameters.empty()) {
			std::string msg;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type)) {
					for (auto node = server->players.begin(); node != server->players.end(); ++node) {
						if (jessilib::findi(node->name, parameters) != std::string::npos) {
							std::string playerName = RenX::getFormattedPlayerName(*node);
							msg = string_printf(IRCCOLOR "03[Steam] " IRCCOLOR "%.*s (ID: %d) ", playerName.size(),
								playerName.data(), node->id);
							if (node->steamid != 0) {
								msg += "is using steam ID " IRCBOLD;
								msg += server->formatSteamID(*node);
								msg += string_printf(IRCBOLD "; Steam Profile: " IRCBOLD "https://steamcommunity.com/profiles/%llu" IRCBOLD, node->steamid);
							}
							else
								msg += "is not using steam.";

							source->sendMessage(channel, msg);
						}
					}
				}
			}
			if (msg.empty())
				source->sendNotice(nick, "Error: Player not found."sv);
		}
		else
		{
			unsigned int total;
			unsigned int realPlayers;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					total = 0;
					realPlayers = 0;
					for (auto node = server->players.begin(); node != server->players.end(); ++node)
					{
						if (node->isBot == false)
						{
							realPlayers++;
							if (node->steamid != 0)
								total++;
						}
					}

					if (realPlayers != 0)
						source->sendMessage(channel, string_printf("%.2f%% (%u/%u) of players are using Steam.", ((double)total * 100) / ((double)realPlayers), total, realPlayers));
					else
						source->sendMessage(channel, "No players are in-game."sv);
				}
			}
		}
	}
}